

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O3

void __thiscall
chrono::ChFrame<double>::ChFrame(ChFrame<double> *this,ChVector<double> *mv,ChMatrix33<double> *ma)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  
  this->_vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  dVar7 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  dVar13 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  dVar14 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  dVar1 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  dVar2 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  dVar3 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  dVar4 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  dVar5 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  dVar6 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  dVar15 = dVar7 + dVar13 + dVar14;
  if (0.0 <= dVar15) {
    dVar15 = dVar15 + 1.0;
    if (dVar15 < 0.0) {
      dVar7 = sqrt(dVar15);
    }
    else {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar15;
      auVar10 = vsqrtsd_avx(auVar10,auVar10);
      dVar7 = auVar10._0_8_;
    }
    dVar15 = dVar7 * 0.5;
    dVar7 = 0.5 / dVar7;
    dVar13 = (dVar6 - dVar4) * dVar7;
    dVar14 = (dVar2 - dVar5) * dVar7;
    dVar7 = (dVar3 - dVar1) * dVar7;
    goto LAB_001553cf;
  }
  if (dVar13 <= dVar7) {
    if (dVar7 < dVar14) goto LAB_001551ab;
    dVar7 = ((dVar7 - dVar13) - dVar14) + 1.0;
    if (dVar7 < 0.0) {
      dVar8 = sqrt(dVar7);
    }
    else {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = dVar7;
      auVar10 = vsqrtsd_avx(auVar12,auVar12);
      dVar8 = auVar10._0_8_;
    }
    dVar15 = dVar6 - dVar4;
    dVar13 = dVar8 * 0.5;
    dVar8 = 0.5 / dVar8;
    dVar14 = (dVar1 + dVar3) * dVar8;
    dVar7 = (dVar5 + dVar2) * dVar8;
  }
  else if (dVar13 < dVar14) {
LAB_001551ab:
    dVar7 = ((dVar14 - dVar7) - dVar13) + 1.0;
    if (dVar7 < 0.0) {
      dVar8 = sqrt(dVar7);
    }
    else {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar7;
      auVar10 = vsqrtsd_avx(auVar11,auVar11);
      dVar8 = auVar10._0_8_;
    }
    dVar15 = dVar3 - dVar1;
    dVar7 = dVar8 * 0.5;
    dVar8 = 0.5 / dVar8;
    dVar13 = (dVar5 + dVar2) * dVar8;
    dVar14 = (dVar4 + dVar6) * dVar8;
  }
  else {
    dVar7 = ((dVar13 - dVar14) - dVar7) + 1.0;
    if (dVar7 < 0.0) {
      dVar8 = sqrt(dVar7);
    }
    else {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dVar7;
      auVar10 = vsqrtsd_avx(auVar9,auVar9);
      dVar8 = auVar10._0_8_;
    }
    dVar15 = dVar2 - dVar5;
    dVar14 = dVar8 * 0.5;
    dVar8 = 0.5 / dVar8;
    dVar7 = (dVar4 + dVar6) * dVar8;
    dVar13 = (dVar1 + dVar3) * dVar8;
  }
  dVar15 = dVar15 * dVar8;
LAB_001553cf:
  (this->coord).pos.m_data[0] = mv->m_data[0];
  (this->coord).pos.m_data[1] = mv->m_data[1];
  (this->coord).pos.m_data[2] = mv->m_data[2];
  (this->coord).rot.m_data[0] = dVar15;
  (this->coord).rot.m_data[1] = dVar13;
  (this->coord).rot.m_data[2] = dVar14;
  (this->coord).rot.m_data[3] = dVar7;
  dVar7 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  dVar13 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  dVar14 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  dVar1 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  dVar2 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  dVar3 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  dVar4 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = dVar7;
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = dVar13;
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar14;
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = dVar1;
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = dVar2;
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar3;
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = dVar4;
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  return;
}

Assistant:

ChFrame(const ChVector<Real>& mv, const ChMatrix33<Real>& ma) : coord(mv, ma.Get_A_quaternion()), Amatrix(ma) {}